

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmmeta.h
# Opt level: O0

void __thiscall vm_meta_entry_t::release_mem(vm_meta_entry_t *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x20) != 0) {
    free(*(void **)(in_RDI + 0x20));
    *(undefined8 *)(in_RDI + 0x20) = 0;
  }
  if (*(long *)(in_RDI + 0x28) != 0) {
    free(*(void **)(in_RDI + 0x28));
    *(undefined8 *)(in_RDI + 0x28) = 0;
  }
  lib_free_str((char *)0x372dca);
  return;
}

Assistant:

void release_mem()
    {
        /* if this entry has a property table, delete it */
        if (prop_xlat_ != 0)
        {
            /* free it */
            t3free(prop_xlat_);
            
            /* forget the pointer */
            prop_xlat_ = 0;
        }

        /* if this entry has a function translation table, delete it */
        if (func_xlat_ != 0)
        {
            /* free it */
            t3free(func_xlat_);
            
            /* forget the pointer */
            func_xlat_ = 0;
        }

        /* relesae our stored name */
        lib_free_str(image_meta_name_);
    }